

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsm.hpp
# Opt level: O1

void remora::bindings::
     trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
               (long *Afull,long *Bfull,long start,long end)

{
  size_t stride1_1;
  long lVar1;
  ulong uVar2;
  type A;
  type B;
  type Bfront;
  type Bback;
  long local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_a0 = Bfull[2];
  local_b8 = Afull[3];
  local_d0 = local_b8 * start * 8 + *Afull + start * 8;
  local_c8 = end - start;
  local_98 = Bfull[3];
  local_b0 = start * 8 + *Bfull;
  local_c0 = local_c8;
  local_a8 = local_c8;
  if (local_c8 < 0x21) {
    trsm_block<32ul,16ul,false,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>>
              (&local_d0,&local_b0);
  }
  else {
    uVar2 = local_c8 + 0x1f >> 1 & 0xffffffffffffffe0;
    local_50 = local_b0 + uVar2 * 8;
    lVar1 = local_c8 - uVar2;
    local_90 = local_b0;
    local_88 = uVar2;
    local_80 = local_a0;
    local_78 = local_98;
    local_48 = lVar1;
    local_40 = local_a0;
    local_38 = local_98;
    trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
              (Afull,Bfull,start,uVar2 + start);
    local_70 = local_b8 * uVar2 * 8 + local_d0;
    local_58 = local_b8;
    local_68 = lVar1;
    local_60 = uVar2;
    gemm<remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::row_major,remora::column_major,remora::dense_tag,remora::dense_tag>
              (0xbff0000000000000,&local_70,&local_90,&local_50);
    trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
              (Afull,Bfull,uVar2 + start,end);
  }
  return;
}

Assistant:

void trsm_recursive(
	matrix_expression<MatA, cpu_tag> const& Afull,
	matrix_expression<MatB, cpu_tag> & Bfull,
	std::size_t start,
	std::size_t end,
	Triangular t,
	left l
){
	static std::size_t const Block_Size =  32;
	std::size_t num_rhs = Bfull().size2();
	auto A = subrange(Afull,start,end,start,end);
	auto B = subrange(Bfull,start,end,0,num_rhs);
	//if the matrix is small enough call the computation kernel directly for the block
	if(A.size1() <= Block_Size){
		trsm_block<Block_Size,16,Triangular::is_unit>(A,B,triangular_tag<Triangular::is_upper,false>(), typename MatB::orientation());
		return;
	}
	std::size_t size = A.size1();
	std::size_t numBlocks =(A.size1()+Block_Size-1)/Block_Size;
	std::size_t split = numBlocks/2*Block_Size;
	auto Bfront = subrange(B,0,split,0,num_rhs);
	auto Bback = subrange(B,split,size,0,num_rhs);

	//otherwise run the kernel recursively
	if(Triangular::is_upper){ //Upper triangular case
		trsm_recursive(Afull, Bfull,start+split,end, t, l);
		kernels::gemm(subrange(A,0,split,split,size), Bback, Bfront, -1.0);
		trsm_recursive(Afull, Bfull,start,start+split, t, l);
	}else{// Lower triangular caste
		trsm_recursive(Afull, Bfull,start,start+split, t, l);
		kernels::gemm(subrange(A,split,size,0,split), Bfront, Bback, -1.0);
		trsm_recursive(Afull, Bfull,start+split,end, t, l);
	}
}